

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall
Fl_Text_Buffer::select
          (Fl_Text_Buffer *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  int extraout_EAX;
  int iVar1;
  int iVar2;
  Fl_Text_Selection oldSelection;
  Fl_Text_Selection local_10;
  
  local_10.mSelected = (this->mPrimary).mSelected;
  local_10._9_3_ = *(undefined3 *)&(this->mPrimary).field_0x9;
  local_10.mStart = (this->mPrimary).mStart;
  local_10.mEnd = (this->mPrimary).mEnd;
  iVar1 = (int)__readfds;
  (this->mPrimary).mSelected = __nfds != iVar1;
  iVar2 = iVar1;
  if (__nfds < iVar1) {
    iVar2 = __nfds;
  }
  (this->mPrimary).mStart = iVar2;
  if (iVar1 < __nfds) {
    iVar1 = __nfds;
  }
  (this->mPrimary).mEnd = iVar1;
  redisplay_selection(this,&local_10,&this->mPrimary);
  return extraout_EAX;
}

Assistant:

void Fl_Text_Buffer::select(int start, int end)
{
  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))  
  
  Fl_Text_Selection oldSelection = mPrimary;
  
  mPrimary.set(start, end);
  redisplay_selection(&oldSelection, &mPrimary);
}